

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

Instance *
instance_copy(Instance *__return_storage_ptr__,Instance *instance,_Bool allocate,_Bool deep_copy)

{
  size_t __n;
  int iVar1;
  double *pdVar2;
  Vec2d *pVVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  int iVar5;
  long lVar6;
  
  __return_storage_ptr__->demands = (double *)0x0;
  __return_storage_ptr__->profits = (double *)0x0;
  *(undefined8 *)&__return_storage_ptr__->rounding_strat = 0;
  __return_storage_ptr__->positions = (Vec2d *)0x0;
  __return_storage_ptr__->num_customers = 0;
  __return_storage_ptr__->num_vehicles = 0;
  __return_storage_ptr__->vehicle_cap = 0.0;
  __return_storage_ptr__->name = (char *)0x0;
  __return_storage_ptr__->comment = (char *)0x0;
  __return_storage_ptr__->edge_weight = (double *)0x0;
  iVar1 = instance->num_customers;
  lVar6 = (long)iVar1 + 1;
  __return_storage_ptr__->num_customers = iVar1;
  __return_storage_ptr__->num_vehicles = instance->num_vehicles;
  __return_storage_ptr__->vehicle_cap = instance->vehicle_cap;
  iVar5 = (int)lVar6;
  if ((int)CONCAT71(in_register_00000011,allocate) != 0) {
    if (instance->edge_weight != (double *)0x0) {
      pdVar2 = (double *)malloc((long)((iVar5 * iVar1) / 2) << 3);
      __return_storage_ptr__->edge_weight = pdVar2;
    }
    pdVar2 = (double *)malloc(lVar6 * 8);
    __return_storage_ptr__->profits = pdVar2;
    pdVar2 = (double *)malloc(lVar6 * 8);
    __return_storage_ptr__->demands = pdVar2;
    pVVar3 = (Vec2d *)malloc(lVar6 * 0x10);
    __return_storage_ptr__->positions = pVVar3;
    pcVar4 = strdup(instance->name);
    __return_storage_ptr__->name = pcVar4;
    pcVar4 = strdup(instance->comment);
    __return_storage_ptr__->comment = pcVar4;
  }
  if (deep_copy) {
    __n = (long)iVar5 * 8;
    memcpy(__return_storage_ptr__->profits,instance->profits,__n);
    memcpy(__return_storage_ptr__->demands,instance->demands,__n);
    memcpy(__return_storage_ptr__->positions,instance->positions,(long)iVar5 << 4);
    if (instance->edge_weight != (double *)0x0) {
      memcpy(__return_storage_ptr__->edge_weight,instance->edge_weight,
             (long)((iVar5 * iVar1) / 2) << 3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Instance instance_copy(const Instance *instance, bool allocate,
                       bool deep_copy) {
    Instance result = {0};
    int32_t n = instance->num_customers + 1;

    result.num_customers = instance->num_customers;
    result.num_vehicles = instance->num_vehicles;
    result.vehicle_cap = instance->vehicle_cap;

    if (allocate) {
        if (instance->edge_weight) {
            result.edge_weight =
                malloc(sizeof(*instance->edge_weight) * hm_nentries(n));
        }

        result.profits = malloc(n * sizeof(*result.profits));
        result.demands = malloc(n * sizeof(*result.demands));
        result.positions = malloc(n * sizeof(*result.positions));

        result.name = strdup(instance->name);
        result.comment = strdup(instance->comment);
    }

    if (deep_copy) {
        memcpy(result.profits, instance->profits, n * sizeof(*result.profits));
        memcpy(result.demands, instance->demands, n * sizeof(*result.demands));
        memcpy(result.positions, instance->positions,
               n * sizeof(*result.positions));

        if (instance->edge_weight) {
            memcpy(result.edge_weight, instance->edge_weight,
                   hm_nentries(n) * sizeof(*result.edge_weight));
        }
    }

    return result;
}